

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O1

void incifingray(global_State *g,GCObject *o,lu_mem *count)

{
  byte bVar1;
  
  if (g->gcstate < 3) {
    bVar1 = o->marked;
    if ((bVar1 & 0x38) == 0 || (bVar1 & 7) == 6) {
      *count = *count + 1;
      if (-1 < (char)bVar1) {
        __assert_fail("((o->marked) & ((1<<(7))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1e0,"void incifingray(global_State *, GCObject *, lu_mem *)");
      }
      o->marked = bVar1 & 0x7f;
    }
  }
  return;
}

Assistant:

static void incifingray (global_State *g, GCObject *o, lu_mem *count) {
  if (!keepinvariant(g))
    return;  /* gray lists not being kept in these phases */

  /* these are the ones that must be in gray lists */
  if (isgray(o) || getage(o) == G_TOUCHED2) {
    (*count)++;
    lua_assert(testbit(o->marked, TESTBIT));
    resetbit(o->marked, TESTBIT);  /* prepare for next cycle */
  }
}